

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:214:32)>
::getImpl(SimpleTransformPromiseNode<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:214:32)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<int> depResult;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<int>_>_2 local_360;
  NullableValue<kj::Exception> local_358;
  char local_1c0;
  ExceptionOr<kj::Promise<int>_> local_1b8;
  
  local_358.isSet = false;
  local_1c0 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_358);
  if (local_358.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1b8,&local_358.field_1.value);
    local_1b8.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<int>_>::operator=((ExceptionOr<kj::Promise<int>_> *)output,&local_1b8);
    ExceptionOr<kj::Promise<int>_>::~ExceptionOr(&local_1b8);
  }
  else if (local_1c0 == '\x01') {
    anon_class_8_1_ac918ff5_for_func::operator()
              ((anon_class_8_1_ac918ff5_for_func *)&local_360.value,(int)this + 0x20);
    local_1b8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b8.value.ptr.isSet = true;
    local_1b8.value.ptr.field_1 = local_360;
    local_360 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<int>_>_2)0x0;
    ExceptionOr<kj::Promise<int>_>::operator=((ExceptionOr<kj::Promise<int>_> *)output,&local_1b8);
    ExceptionOr<kj::Promise<int>_>::~ExceptionOr(&local_1b8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_360.value);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_358);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }